

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFont::LoadTranslations(FFont *this)

{
  int iVar1;
  FTexture *pic;
  long *plVar2;
  BYTE *pBVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  double *luminosity;
  BYTE usedcolors [256];
  BYTE identity [256];
  double *local_240;
  BYTE local_238 [256];
  BYTE local_138 [264];
  
  iVar4 = this->LastChar;
  iVar1 = this->FirstChar;
  memset(local_238,0,0x100);
  uVar5 = (iVar4 - iVar1) + 1;
  if (uVar5 == 0) {
    iVar4 = SimpleTranslation(local_238,this->PatchRemap,local_138,&local_240);
    this->ActiveColors = iVar4;
  }
  else {
    lVar6 = 0;
    do {
      pic = *(FTexture **)((long)&this->Chars->Pic + lVar6);
      if (pic != (FTexture *)0x0) {
        (*pic->_vptr_FTexture[9])(pic);
        pic[1].Scale.X = 0.0;
        RecordTextureColors(pic,local_238);
      }
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar6);
    iVar4 = SimpleTranslation(local_238,this->PatchRemap,local_138,&local_240);
    this->ActiveColors = iVar4;
    if (uVar5 != 0) {
      lVar6 = 0;
      do {
        plVar2 = *(long **)((long)&this->Chars->Pic + lVar6);
        if (plVar2 != (long *)0x0) {
          pBVar3 = this->PatchRemap;
          (**(code **)(*plVar2 + 0x48))(plVar2);
          plVar2[0xd] = (long)pBVar3;
        }
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar5 << 4 != lVar6);
      iVar4 = this->ActiveColors;
    }
  }
  BuildTranslations(this,local_240,local_138,TranslationParms[0].Array,iVar4,(PalEntry *)0x0);
  if (local_240 != (double *)0x0) {
    operator_delete__(local_240);
  }
  return;
}

Assistant:

void FFont::LoadTranslations()
{
	unsigned int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;

	memset (usedcolors, 0, 256);
	for (unsigned int i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	for (unsigned int i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], ActiveColors, NULL);

	delete[] luminosity;
}